

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O3

int __thiscall ncnn::InnerProduct::create_pipeline(InnerProduct *this,Option *opt)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *this_00;
  float fVar1;
  int *piVar2;
  void *pvVar3;
  long *plVar4;
  Allocator *pAVar5;
  int iVar6;
  Layer *pLVar7;
  long lVar8;
  size_t sVar9;
  bool *pbVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  Option opt_q;
  ParamDict pd;
  Mat local_a48;
  Option *local_a00;
  bool *local_9f8;
  size_t local_9f0;
  ModelBinFromMatArray local_9e8;
  size_t local_9d8;
  int local_9d0;
  Allocator *local_9c8;
  undefined4 local_9c0;
  int local_9bc;
  undefined8 local_9b8;
  long local_9b0;
  void *local_9a8;
  int *local_9a0;
  size_t local_998;
  int local_990;
  Allocator *local_988;
  undefined4 local_980;
  int local_97c;
  undefined8 local_978;
  long local_970;
  undefined1 local_968 [16];
  undefined4 local_958;
  int iStack_954;
  Allocator *pAStack_950;
  undefined4 local_948;
  undefined4 uStack_944;
  undefined4 uStack_940;
  undefined4 uStack_93c;
  undefined8 local_938;
  ParamDict local_930;
  
  sVar9 = (this->weight_data).elemsize;
  bVar14 = opt->use_int8_inference;
  local_a00 = opt;
  if (sVar9 == 1) {
    if ((bVar14 & 1U) == 0) {
      create_pipeline();
      return -1;
    }
    this->use_int8_inference = (bool)(bVar14 & 1U);
    if ((bool)(bVar14 & 1U) == false) {
      return 0;
    }
  }
  else {
    if ((sVar9 == 4 & bVar14) == 0) {
      this->use_int8_inference = false;
      pbVar10 = &this->use_int8_inference;
      goto LAB_0013553e;
    }
    bVar14 = this->int8_scale_term != 0;
    this->use_int8_inference = bVar14;
    if (!bVar14) {
      return 0;
    }
  }
  pLVar7 = create_layer(0x39);
  this->quantize = pLVar7;
  ParamDict::ParamDict(&local_930);
  ParamDict::set(&local_930,0,this->bottom_blob_int8_scale);
  (*this->quantize->_vptr_Layer[2])(this->quantize,&local_930);
  (*this->quantize->_vptr_Layer[4])(this->quantize,local_a00);
  lVar11 = 0x8c0;
  do {
    piVar2 = *(int **)((long)&local_930.params[0].v.data + lVar11);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = *(void **)((long)&local_930.params[0].type + lVar11);
        plVar4 = *(long **)((long)&local_930.params[0].v.elempack + lVar11);
        if (plVar4 == (long *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (**(code **)(*plVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_930.params[0].v.data + lVar11 + 4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar11 + 4) = 0;
    *(undefined8 *)((long)&local_930.params[0].type + lVar11) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.data + lVar11) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar11) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.dims + lVar11) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.h + lVar11) = 0;
    lVar11 = lVar11 + -0x48;
  } while (lVar11 != -0x40);
  this_00 = &this->dequantize_ops;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(this_00,(long)this->num_output)
  ;
  pbVar10 = &this->use_int8_inference;
  if (0 < this->num_output) {
    lVar11 = 0;
    local_9f8 = &this->use_int8_inference;
    local_9f0 = sVar9;
    do {
      pLVar7 = create_layer(0x3a);
      (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar11] = pLVar7;
      fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + lVar11 * 4);
      local_968 = ZEXT416(~-(uint)(fVar1 == 0.0) &
                          (uint)(1.0 / (this->bottom_blob_int8_scale * fVar1)));
      ParamDict::ParamDict(&local_930);
      ParamDict::set(&local_930,0,(float)local_968._0_4_);
      ParamDict::set(&local_930,1,this->bias_term);
      ParamDict::set(&local_930,2,1);
      pLVar7 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      (*pLVar7->_vptr_Layer[2])(pLVar7,&local_930);
      local_a48.allocator = (this->bias_data).allocator;
      local_a48.elempack = (this->bias_data).elempack;
      local_a48.elemsize = (this->bias_data).elemsize;
      local_a48.data = (void *)(local_a48.elemsize * lVar11 + (long)(this->bias_data).data);
      local_a48.refcount = (int *)0x0;
      local_a48.dims = 1;
      local_a48.w = 1;
      local_a48.h = 1;
      local_a48.c = 1;
      local_a48.cstep = 1;
      pLVar7 = (this->dequantize_ops).
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      ModelBinFromMatArray::ModelBinFromMatArray(&local_9e8,&local_a48);
      (*pLVar7->_vptr_Layer[3])(pLVar7,&local_9e8);
      ModelBin::~ModelBin(&local_9e8.super_ModelBin);
      (*(this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar11]->_vptr_Layer[4])();
      if (local_a48.refcount != (int *)0x0) {
        LOCK();
        *local_a48.refcount = *local_a48.refcount + -1;
        UNLOCK();
        if (*local_a48.refcount == 0) {
          if (local_a48.allocator == (Allocator *)0x0) {
            if (local_a48.data != (void *)0x0) {
              free(local_a48.data);
            }
          }
          else {
            (*(local_a48.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      lVar8 = 0x8c0;
      do {
        piVar2 = *(int **)((long)&local_930.params[0].v.data + lVar8);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = *(void **)((long)&local_930.params[0].type + lVar8);
            plVar4 = *(long **)((long)&local_930.params[0].v.elempack + lVar8);
            if (plVar4 == (long *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (**(code **)(*plVar4 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_930.params[0].v.data + lVar8 + 4) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar8 + 4) = 0;
        *(undefined8 *)((long)&local_930.params[0].type + lVar8) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.data + lVar8) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar8) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.dims + lVar8) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.h + lVar8) = 0;
        lVar8 = lVar8 + -0x48;
      } while (lVar8 != -0x40);
      lVar11 = lVar11 + 1;
      sVar9 = local_9f0;
      pbVar10 = local_9f8;
    } while (lVar11 < this->num_output);
  }
LAB_0013553e:
  if (sVar9 != 4) {
    return 0;
  }
  if ((*pbVar10 & 1U) != 0) {
    local_a48.cstep = (size_t)this->weight_data_size;
    local_a48.data = (void *)0x0;
    local_a48.refcount = (int *)0x0;
    local_a48.elemsize = 1;
    local_a48.elempack = 1;
    local_a48.allocator = (Allocator *)0x0;
    local_a48.w = this->weight_data_size;
    local_a48.dims = 1;
    local_a48.h = 1;
    local_a48.c = 1;
    if (local_a48.cstep != 0) {
      uVar12 = local_a48.cstep + 3 & 0xfffffffffffffffc;
      local_930.params[0]._0_8_ = (void *)0x0;
      iVar6 = posix_memalign((void **)&local_930,0x10,uVar12 + 4);
      local_a48.data = (void *)0x0;
      if (iVar6 == 0) {
        local_a48.data = (void *)local_930.params[0]._0_8_;
      }
      local_a48.refcount = (int *)((long)local_a48.data + uVar12);
      *(undefined4 *)((long)local_a48.data + uVar12) = 1;
      if ((long)local_a48.c * local_a48.cstep != 0) {
        iVar6 = this->weight_data_size / this->num_output;
        if (0 < this->num_output) {
          lVar11 = (long)iVar6;
          lVar8 = 0;
          do {
            pLVar7 = create_layer(0x39);
            ParamDict::ParamDict(&local_930);
            ParamDict::set(&local_930,0,
                           *(float *)((long)(this->weight_data_int8_scales).data + lVar8 * 4));
            (*pLVar7->_vptr_Layer[2])(pLVar7,&local_930);
            (*pLVar7->_vptr_Layer[4])(pLVar7,local_a00);
            local_958 = *(undefined4 *)local_a00;
            iStack_954 = local_a00->num_threads;
            local_948 = *(undefined4 *)&local_a00->workspace_allocator;
            uStack_944 = *(undefined4 *)((long)&local_a00->workspace_allocator + 4);
            uStack_940._0_1_ = local_a00->use_winograd_convolution;
            uStack_940._1_1_ = local_a00->use_sgemm_convolution;
            uStack_940._2_1_ = local_a00->use_int8_inference;
            uStack_940._3_1_ = local_a00->use_vulkan_compute;
            uStack_93c._0_1_ = local_a00->use_fp16_packed;
            uStack_93c._1_1_ = local_a00->use_fp16_storage;
            uStack_93c._2_1_ = local_a00->use_fp16_arithmetic;
            uStack_93c._3_1_ = local_a00->use_int8_storage;
            local_938._0_1_ = local_a00->use_int8_arithmetic;
            local_938._1_1_ = local_a00->use_packing_layout;
            local_938._2_6_ = *(undefined6 *)&local_a00->field_0x22;
            pAStack_950 = local_a48.allocator;
            local_9d8 = (this->weight_data).elemsize;
            local_9e8.super_ModelBin._vptr_ModelBin =
                 (_func_int **)(local_9d8 * lVar8 * lVar11 + (long)(this->weight_data).data);
            local_9d0 = (this->weight_data).elempack;
            local_9c8 = (this->weight_data).allocator;
            local_9e8.weights = (Mat *)0x0;
            local_9c0 = 1;
            local_9b8 = 0x100000001;
            local_9a8 = (void *)(lVar8 * lVar11 * local_a48.elemsize + (long)local_a48.data);
            local_9a0 = (int *)0x0;
            local_998 = local_a48.elemsize;
            local_990 = local_a48.elempack;
            local_988 = local_a48.allocator;
            local_980 = 1;
            local_978 = 0x100000001;
            local_9bc = iVar6;
            local_9b0 = lVar11;
            local_97c = iVar6;
            local_970 = lVar11;
            (*pLVar7->_vptr_Layer[7])(pLVar7,&local_9e8,&local_9a8,&local_958);
            (*pLVar7->_vptr_Layer[1])(pLVar7);
            if (local_9a0 != (int *)0x0) {
              LOCK();
              *local_9a0 = *local_9a0 + -1;
              UNLOCK();
              if (*local_9a0 == 0) {
                if (local_988 == (Allocator *)0x0) {
                  if (local_9a8 != (void *)0x0) {
                    free(local_9a8);
                  }
                }
                else {
                  (*local_988->_vptr_Allocator[3])();
                }
              }
            }
            if (local_9e8.weights != (Mat *)0x0) {
              LOCK();
              *(int *)&(local_9e8.weights)->data = *(int *)&(local_9e8.weights)->data + -1;
              UNLOCK();
              if (*(int *)&(local_9e8.weights)->data == 0) {
                if (local_9c8 == (Allocator *)0x0) {
                  if (local_9e8.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                    free(local_9e8.super_ModelBin._vptr_ModelBin);
                  }
                }
                else {
                  (*local_9c8->_vptr_Allocator[3])();
                }
              }
            }
            lVar13 = 0x8c0;
            do {
              piVar2 = *(int **)((long)&local_930.params[0].v.data + lVar13);
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  pvVar3 = *(void **)((long)&local_930.params[0].type + lVar13);
                  plVar4 = *(long **)((long)&local_930.params[0].v.elempack + lVar13);
                  if (plVar4 == (long *)0x0) {
                    if (pvVar3 != (void *)0x0) {
                      free(pvVar3);
                    }
                  }
                  else {
                    (**(code **)(*plVar4 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar13 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar13 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].type + lVar13) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar13) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar13) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.dims + lVar13) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.h + lVar13) = 0;
              lVar13 = lVar13 + -0x48;
            } while (lVar13 != -0x40);
            lVar8 = lVar8 + 1;
          } while (lVar8 < this->num_output);
        }
        if (&this->weight_data != &local_a48) {
          if (local_a48.refcount != (int *)0x0) {
            LOCK();
            *local_a48.refcount = *local_a48.refcount + 1;
            UNLOCK();
          }
          piVar2 = (this->weight_data).refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              pvVar3 = (this->weight_data).data;
              pAVar5 = (this->weight_data).allocator;
              if (pAVar5 == (Allocator *)0x0) {
                if (pvVar3 != (void *)0x0) {
                  free(pvVar3);
                }
              }
              else {
                (*pAVar5->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_data).data = local_a48.data;
          (this->weight_data).refcount = local_a48.refcount;
          (this->weight_data).elemsize = local_a48.elemsize;
          (this->weight_data).elempack = local_a48.elempack;
          (this->weight_data).allocator = local_a48.allocator;
          (this->weight_data).dims = local_a48.dims;
          (this->weight_data).w = local_a48.w;
          (this->weight_data).h = local_a48.h;
          (this->weight_data).c = local_a48.c;
          (this->weight_data).cstep = local_a48.cstep;
        }
        if (local_a48.refcount != (int *)0x0) {
          LOCK();
          *local_a48.refcount = *local_a48.refcount + -1;
          UNLOCK();
          if (*local_a48.refcount == 0) {
            if (local_a48.allocator == (Allocator *)0x0) {
              if (local_a48.data != (void *)0x0) {
                free(local_a48.data);
              }
            }
            else {
              (*(local_a48.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        return 0;
      }
      LOCK();
      *local_a48.refcount = *local_a48.refcount + -1;
      UNLOCK();
      if (*local_a48.refcount == 0) {
        if (local_a48.allocator == (Allocator *)0x0) {
          if (local_a48.data != (void *)0x0) {
            free(local_a48.data);
          }
        }
        else {
          (*(local_a48.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    return -100;
  }
  return 0;
}

Assistant:

int InnerProduct::create_pipeline(const Option& opt)
{
    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !opt.use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    use_int8_inference = opt.use_int8_inference && (weight_data_is_int8 || (weight_data_is_float32 && int8_scale_term));

    // initial the quantize,dequantize op layer
    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);

            quantize->create_pipeline(opt);
        }

        dequantize_ops.resize(num_output);
        for (int n=0; n<num_output; n++)
        {
            dequantize_ops[n] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f;

            if (weight_data_int8_scales[n] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[n]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);  // bias_term
            pd.set(2, 1);          // bias_data_size

            dequantize_ops[n]->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(n, 1);

            dequantize_ops[n]->load_model(ModelBinFromMatArray(weights));

            dequantize_ops[n]->create_pipeline(opt);
        }
    }

    // runtime quantize the weight data
    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_output = weight_data_size / num_output;

        for (int n=0; n<num_output; n++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[n]);// scale

            op->load_param(pd);

            op->create_pipeline(opt);

            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_n = weight_data.range(weight_data_size_output * n, weight_data_size_output);
            Mat int8_weight_data_n = int8_weight_data.range(weight_data_size_output * n, weight_data_size_output);
            op->forward(weight_data_n, int8_weight_data_n, opt_q);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    return 0;
}